

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Person.cpp
# Opt level: O0

void __thiscall Person::setAddress(Person *this,Address *address)

{
  Address *address_local;
  Person *this_local;
  
  Address::operator=(&this->address,address);
  return;
}

Assistant:

void Person::setAddress(const Address &address) {

    Person::address = address;
}